

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.cc
# Opt level: O2

void __thiscall
InvertDatabase::print_idlist
          (InvertDatabase *this,ostream *idlstrm,
          shared_ptr<std::vector<int,_std::allocator<int>_>_> *ival,int supsz)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  
  if (supsz < 1) {
    return;
  }
  piVar2 = (((ival->
             super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>)
            ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  iVar5 = 0;
  piVar4 = piVar2;
  do {
    iVar1 = *piVar4;
    piVar4 = piVar2 + iVar5;
    iVar6 = 0;
    while( true ) {
      if (supsz <= iVar5) {
        poVar3 = (ostream *)std::ostream::operator<<(idlstrm,iVar1);
        poVar3 = std::operator<<(poVar3," ");
        std::ostream::operator<<(poVar3,iVar6);
        return;
      }
      if (iVar1 != *piVar4) break;
      iVar6 = iVar6 + 1;
      iVar5 = iVar5 + 2;
      piVar4 = piVar4 + 2;
    }
    poVar3 = (ostream *)std::ostream::operator<<(idlstrm,iVar1);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar6);
    std::operator<<(poVar3," ");
  } while( true );
}

Assistant:

void InvertDatabase::print_idlist(ostream& idlstrm, shared_ptr<vint> ival, int supsz) {
    int i, cid, cnt;
    int *ival_data = ival->data();

    if (supsz > 0) {
        cid = ival_data[0];
        cnt = 0;
        for (i = 0; i < supsz;) {
            if (cid == ival_data[i]) {
                cnt++;
                i += 2;
            } else {
                idlstrm << cid << " " << cnt << " ";
                cid = ival_data[i];
                cnt = 0;
            }
        }
        idlstrm << cid << " " << cnt;
    }
}